

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinNative
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  _Base_ptr p_Var1;
  Allocator *this_00;
  pointer pPVar2;
  AST *pAVar3;
  iterator iVar4;
  Identifier *pIVar5;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  *this_01;
  pointer pPVar6;
  pointer pPVar7;
  allocator_type *in_RCX;
  char *__s;
  size_t __n;
  _Base_ptr s;
  UString *__n_00;
  long lVar8;
  pointer pPVar9;
  pointer pPVar10;
  Value VVar11;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  pointer local_c0;
  Params hc_params;
  UString local_88;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_68;
  string builtin_name;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"native",(allocator<char> *)&hc_params);
  builtin_name._M_dataplus._M_p._0_4_ = 0x13;
  __l._M_len = 1;
  __l._M_array = (iterator)&builtin_name;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)&local_68,__l,in_RCX);
  validateBuiltinArgs(this,loc,(string *)&local_88,args,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)&local_68);
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~_Vector_base(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  encode_utf8(&builtin_name,
              (UString *)
              ((((args->
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                 )._M_impl.super__Vector_impl_data._M_start)->v).h + 1));
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>_>_>
          ::find(&(this->nativeCallbacks)._M_t,&builtin_name);
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(this->nativeCallbacks)._M_t._M_impl.super__Rb_tree_header) {
    (this->scratch).t = NULL_TYPE;
  }
  else {
    hc_params.
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    hc_params.
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    hc_params.
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    s = iVar4._M_node[2]._M_left;
    p_Var1 = iVar4._M_node[2]._M_right;
    pPVar10 = (pointer)0x0;
    pPVar9 = (pointer)0x0;
    local_c0 = (pointer)0x0;
    for (; s != p_Var1; s = s + 1) {
      this_00 = this->alloc;
      decode_utf8(&local_88,(string *)s);
      __n_00 = &local_88;
      pIVar5 = Allocator::makeIdentifier(this_00,&local_88);
      if (pPVar9 == pPVar10) {
        this_01 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                   *)std::
                     vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                     ::_M_check_len(&hc_params,(size_type)__n_00,__s);
        pPVar6 = std::
                 _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                 ::_M_allocate(this_01,(size_t)__n_00);
        lVar8 = (long)pPVar10 - (long)local_c0;
        *(Identifier **)((long)pPVar6 + lVar8) = pIVar5;
        *(undefined8 *)((long)pPVar6 + lVar8 + 8) = 0;
        pPVar2 = pPVar6;
        for (pPVar7 = local_c0; pPVar9 = pPVar2 + 1, pPVar7 != pPVar10; pPVar7 = pPVar7 + 1) {
          pAVar3 = pPVar7->def;
          pPVar2->id = pPVar7->id;
          pPVar2->def = pAVar3;
          pPVar2 = pPVar9;
        }
        std::
        _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
        ::_M_deallocate((_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                         *)local_c0,(pointer)(lVar8 >> 4),__n);
        pPVar10 = pPVar6 + (long)this_01;
        local_c0 = pPVar6;
        hc_params.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
        ._M_impl.super__Vector_impl_data._M_start = pPVar6;
        hc_params.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar10;
      }
      else {
        pPVar9->id = pIVar5;
        pPVar9->def = (AST *)0x0;
        pPVar9 = pPVar9 + 1;
      }
      hc_params.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
      ._M_impl.super__Vector_impl_data._M_finish = pPVar9;
      std::__cxx11::u32string::~u32string((u32string *)&local_88);
    }
    VVar11 = makeBuiltin(this,&builtin_name,&hc_params);
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
    ::~vector(&hc_params);
    (this->scratch).t = FUNCTION;
    (this->scratch).v = VVar11._0_8_;
  }
  std::__cxx11::string::~string((string *)&builtin_name);
  return (AST *)0x0;
}

Assistant:

const AST *builtinNative(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "native", args, {Value::STRING});

        std::string builtin_name = encode_utf8(static_cast<HeapString *>(args[0].v.h)->value);

        VmNativeCallbackMap::const_iterator nit = nativeCallbacks.find(builtin_name);
        if (nit == nativeCallbacks.end()) {
            scratch = makeNull();
        } else {
            const VmNativeCallback &cb = nit->second;
            scratch = makeNativeBuiltin(builtin_name, cb.params);
        }
        return nullptr;
    }